

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O2

void duckdb::ArrowTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_7ca;
  allocator_type local_7c9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7b0;
  string local_798;
  string local_778;
  LogicalType local_758 [3];
  TableFunction arrow_dumb;
  TableFunction local_558;
  TableFunction local_3a0;
  TableFunction arrow;
  
  ::std::__cxx11::string::string((string *)&local_778,"arrow_scan",(allocator *)local_758);
  LogicalType::LogicalType((LogicalType *)&arrow_dumb,POINTER);
  LogicalType::LogicalType
            ((LogicalType *)
             &arrow_dumb.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
              .field_2,POINTER);
  LogicalType::LogicalType
            ((LogicalType *)
             &arrow_dumb.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
              extra_info._M_string_length,POINTER);
  __l._M_len = 3;
  __l._M_array = (iterator)&arrow_dumb;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7b0,__l,&local_7ca);
  TableFunction::TableFunction
            (&arrow,&local_778,(vector<duckdb::LogicalType,_true> *)&local_7b0,ArrowScanFunction,
             ArrowScanBind,ArrowScanInitGlobal,ArrowScanInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7b0);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&arrow_dumb.super_SimpleNamedParameterFunction.super_SimpleFunction.
                       super_Function._vptr_Function + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_778);
  arrow.cardinality = ArrowScanCardinality;
  arrow.get_partition_data = ArrowGetPartitionData;
  arrow.projection_pushdown = true;
  arrow.filter_pushdown = true;
  arrow.filter_prune = true;
  arrow.supports_pushdown_type = ArrowPushdownType;
  TableFunction::TableFunction(&local_3a0,&arrow);
  BuiltinFunctions::AddFunction(set,&local_3a0);
  TableFunction::~TableFunction(&local_3a0);
  ::std::__cxx11::string::string((string *)&local_798,"arrow_scan_dumb",(allocator *)&local_7ca);
  LogicalType::LogicalType(local_758,POINTER);
  LogicalType::LogicalType(local_758 + 1,POINTER);
  LogicalType::LogicalType(local_758 + 2,POINTER);
  __l_00._M_len = 3;
  __l_00._M_array = local_758;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7c8,__l_00,&local_7c9);
  TableFunction::TableFunction
            (&arrow_dumb,&local_798,(vector<duckdb::LogicalType,_true> *)&local_7c8,
             ArrowScanFunction,ArrowScanBindDumb,ArrowScanInitGlobal,ArrowScanInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7c8);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_758[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_798);
  arrow_dumb.cardinality = ArrowScanCardinality;
  arrow_dumb.get_partition_data = ArrowGetPartitionData;
  arrow_dumb.projection_pushdown = false;
  arrow_dumb.filter_pushdown = false;
  arrow_dumb.filter_prune = false;
  TableFunction::TableFunction(&local_558,&arrow_dumb);
  BuiltinFunctions::AddFunction(set,&local_558);
  TableFunction::~TableFunction(&local_558);
  TableFunction::~TableFunction(&arrow_dumb);
  TableFunction::~TableFunction(&arrow);
  return;
}

Assistant:

void ArrowTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunction arrow("arrow_scan", {LogicalType::POINTER, LogicalType::POINTER, LogicalType::POINTER},
	                    ArrowScanFunction, ArrowScanBind, ArrowScanInitGlobal, ArrowScanInitLocal);
	arrow.cardinality = ArrowScanCardinality;
	arrow.get_partition_data = ArrowGetPartitionData;
	arrow.projection_pushdown = true;
	arrow.filter_pushdown = true;
	arrow.filter_prune = true;
	arrow.supports_pushdown_type = ArrowPushdownType;
	set.AddFunction(arrow);

	TableFunction arrow_dumb("arrow_scan_dumb", {LogicalType::POINTER, LogicalType::POINTER, LogicalType::POINTER},
	                         ArrowScanFunction, ArrowScanBindDumb, ArrowScanInitGlobal, ArrowScanInitLocal);
	arrow_dumb.cardinality = ArrowScanCardinality;
	arrow_dumb.get_partition_data = ArrowGetPartitionData;
	arrow_dumb.projection_pushdown = false;
	arrow_dumb.filter_pushdown = false;
	arrow_dumb.filter_prune = false;
	set.AddFunction(arrow_dumb);
}